

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlSchemaValPtr xmlSchemaDateNormalize(xmlSchemaValPtr dt,double offset)

{
  ushort *puVar1;
  xmlSchemaValType xVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  _xmlSchemaVal *p_Var6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  undefined8 uVar10;
  ushort uVar11;
  undefined4 uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  xmlSchemaValPtr pxVar16;
  xmlSchemaValPtr value;
  xmlSchemaValPtr value_00;
  long lVar17;
  ulong uVar18;
  xmlSchemaValType xVar19;
  uint *puVar20;
  ulong uVar21;
  xmlChar *pxVar22;
  xmlChar *pxVar23;
  uint uVar24;
  
  xVar2 = dt->type;
  if (((XML_SCHEMAS_DATETIME < xVar2) || ((0xc10U >> (xVar2 & XML_SCHEMAS_NPINTEGER) & 1) == 0)) ||
     ((*(ushort *)((long)&dt->value + 0x18) & 0x1ffe) == 0)) {
    pxVar16 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
    if (pxVar16 == (xmlSchemaValPtr)0x0) {
      return (xmlSchemaValPtr)0x0;
    }
    *(undefined8 *)pxVar16 = 0;
    pxVar16->next = (_xmlSchemaVal *)0x0;
    (pxVar16->value).decimal.hi = 0;
    *(undefined8 *)((long)&pxVar16->value + 0x18) = 0;
    (pxVar16->value).decimal.lo = 0;
    (pxVar16->value).decimal.mi = 0;
    pxVar16->type = xVar2;
    uVar12 = *(undefined4 *)&dt->field_0x4;
    p_Var6 = dt->next;
    uVar7 = (dt->value).decimal.lo;
    uVar8 = (dt->value).decimal.mi;
    uVar9 = (dt->value).decimal.hi;
    uVar10 = *(undefined8 *)((long)&dt->value + 0x18);
    pxVar16->type = dt->type;
    *(undefined4 *)&pxVar16->field_0x4 = uVar12;
    pxVar16->next = p_Var6;
    (pxVar16->value).decimal.lo = uVar7;
    (pxVar16->value).decimal.mi = uVar8;
    (pxVar16->value).decimal.hi = uVar9;
    *(undefined8 *)((long)&pxVar16->value + 0x18) = uVar10;
    pxVar16->next = (_xmlSchemaVal *)0x0;
    return pxVar16;
  }
  pxVar16 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar16 == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  *(undefined8 *)pxVar16 = 0;
  pxVar16->next = (_xmlSchemaVal *)0x0;
  (pxVar16->value).decimal.hi = 0;
  *(undefined8 *)((long)&pxVar16->value + 0x18) = 0;
  (pxVar16->value).decimal.lo = 0;
  (pxVar16->value).decimal.mi = 0;
  pxVar16->type = XML_SCHEMAS_DURATION;
  (pxVar16->value).date.sec = 0.0 - offset;
  xVar2 = dt->type;
  value = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (value == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  *(undefined8 *)value = 0;
  value->next = (_xmlSchemaVal *)0x0;
  (value->value).decimal.hi = 0;
  *(undefined8 *)((long)&value->value + 0x18) = 0;
  (value->value).decimal.lo = 0;
  (value->value).decimal.mi = 0;
  value->type = xVar2;
  xVar2 = dt->type;
  value_00 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (value_00 == (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(value);
    return (xmlSchemaValPtr)0x0;
  }
  *(undefined8 *)value_00 = 0;
  value_00->next = (_xmlSchemaVal *)0x0;
  (value_00->value).decimal.hi = 0;
  *(undefined8 *)((long)&value_00->value + 0x18) = 0;
  (value_00->value).decimal.lo = 0;
  (value_00->value).decimal.mi = 0;
  value_00->type = xVar2;
  uVar12 = *(undefined4 *)&dt->field_0x4;
  p_Var6 = dt->next;
  uVar7 = (dt->value).decimal.lo;
  uVar8 = (dt->value).decimal.mi;
  uVar9 = (dt->value).decimal.hi;
  uVar10 = *(undefined8 *)((long)&dt->value + 0x18);
  value_00->type = dt->type;
  *(undefined4 *)&value_00->field_0x4 = uVar12;
  value_00->next = p_Var6;
  (value_00->value).decimal.lo = uVar7;
  (value_00->value).decimal.mi = uVar8;
  (value_00->value).decimal.hi = uVar9;
  *(undefined8 *)((long)&value_00->value + 0x18) = uVar10;
  value_00->next = (_xmlSchemaVal *)0x0;
  uVar14 = (value_00->value).hex.total;
  if ((uVar14 & 0xf) == 0) {
    (value_00->value).hex.total = uVar14 | 1;
  }
  (pxVar16->value).date.sec =
       (pxVar16->value).date.sec -
       (double)(((int)(short)((value_00->value).decimal.extra << 3) >> 4) * 0x3c);
  puVar1 = (ushort *)((long)&value_00->value + 0x18);
  *puVar1 = *puVar1 & 0xe001;
  uVar14 = (value_00->value).hex.total;
  if ((uVar14 & 0x1f0) == 0) {
    uVar14 = uVar14 | 0x10;
    (value_00->value).hex.total = uVar14;
  }
  dVar3 = (double)(long)((pxVar16->value).qname.name + ((ulong)(uVar14 & 0xf) - 1));
  dVar4 = floor(dVar3 / 12.0);
  uVar14 = (value->value).hex.total;
  uVar24 = (uint)(long)((dVar3 - dVar4 * 12.0) + 1.0) & 0xf;
  (value->value).hex.total = uVar14 & 0xfffffff0 | uVar24;
  pxVar22 = (value_00->value).qname.name + (long)dVar4;
  (value->value).date.year = (long)pxVar22;
  if (pxVar22 == (xmlChar *)0x0) {
    pxVar22 = (xmlChar *)((ulong)((value_00->value).date.year < 1) * 2 + -1);
    (value->value).date.year = (long)pxVar22;
  }
  uVar13 = *(ushort *)((long)&value_00->value + 0x18) & 0x1ffe;
  uVar11 = (ushort)(value->value).decimal.extra;
  *(ushort *)((long)&value->value + 0x18) = uVar11 & 0xe001 | uVar13;
  *(ushort *)((long)&value->value + 0x18) =
       uVar11 & 0xe000 | uVar13 | *(ushort *)((long)&value_00->value + 0x18) & 1;
  dVar3 = (value_00->value).date.sec + (pxVar16->value).date.sec;
  dVar4 = floor((double)(long)dVar3 / 60.0);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar5 = floor(dVar3 / 60.0);
    dVar3 = dVar3 - dVar5 * 60.0;
  }
  (value->value).date.sec = dVar3;
  dVar4 = (double)(long)((ulong)((value_00->value).hex.total >> 0xe & 0x3f) + (long)dVar4);
  dVar5 = floor(dVar4 / 60.0);
  uVar15 = ((uint)(long)(dVar4 - dVar5 * 60.0) & 0x3f) << 0xe;
  (value->value).hex.total = uVar14 & 0xfff03ff0 | uVar24 | uVar15;
  dVar4 = (double)(long)((ulong)((value_00->value).hex.total >> 9 & 0x1f) + (long)dVar5);
  dVar5 = floor(dVar4 / 24.0);
  uVar15 = uVar14 & 0xfff001f0 | uVar24 | uVar15 | ((uint)(long)(dVar4 - dVar5 * 24.0) & 0x1f) << 9;
  (value->value).hex.total = uVar15;
  uVar14 = (value_00->value).hex.total >> 4 & 0x1f;
  if (uVar24 - 1 < 0xc) {
    if (((((ulong)pxVar22 & 3) == 0) && (pxVar22 != (xmlChar *)(((long)pxVar22 / 100) * 100))) ||
       (((long)pxVar22 * -0x70a3d70a3d70a3d7 + 0x51eb851eb851eb0U >> 4 |
        (long)pxVar22 * -0x70a3d70a3d70a3d7 << 0x3c) < 0xa3d70a3d70a3d7)) {
      puVar20 = daysInMonthLeap;
    }
    else {
      puVar20 = daysInMonth;
    }
    uVar24 = puVar20[uVar24 - 1];
    if (uVar24 < uVar14) goto LAB_001cce43;
  }
  uVar24 = uVar14 + (uVar14 == 0);
LAB_001cce43:
  pxVar23 = (pxVar16->value).qname.uri + (ulong)uVar24 + (long)dVar5;
  do {
    uVar14 = uVar15 & 0xf;
    if ((long)pxVar23 < 1) {
      dVar4 = floor((double)(int)(uVar14 - 2) / 12.0);
      uVar18 = (ulong)(((double)(int)(uVar14 - 2) - dVar4 * 12.0) + 1.0);
      uVar21 = -(ulong)(pxVar22 + (long)dVar4 == (xmlChar *)0x0) | (ulong)(pxVar22 + (long)dVar4);
      if ((long)uVar18 < 2) {
        uVar18 = 1;
      }
      if (0xb < (long)uVar18) {
        uVar18 = 0xc;
      }
      lVar17 = uVar21 * -0x70a3d70a3d70a3d7;
      puVar20 = daysInMonth;
      if (0x28f5c28f5c28f5c < (lVar17 + 0x51eb851eb851eb8U >> 2 | lVar17 << 0x3e)) {
        puVar20 = daysInMonthLeap;
      }
      if ((uVar21 & 3) != 0) {
        puVar20 = daysInMonth;
      }
      if ((lVar17 + 0x51eb851eb851eb0U >> 4 | lVar17 << 0x3c) < 0xa3d70a3d70a3d7) {
        puVar20 = daysInMonthLeap;
      }
      uVar18 = (ulong)puVar20[(uVar18 & 0xffffffff) - 1];
      lVar17 = -1;
    }
    else {
      uVar24 = uVar14 - 1;
      if (0xb < uVar24) {
LAB_001cd057:
        uVar24 = (uint)pxVar23 & 0x1f;
        (value->value).hex.total = uVar15 & 0xfffffe0f | uVar24 << 4;
        xVar2 = value->type;
        if (xVar2 != XML_SCHEMAS_DATETIME) {
          xVar19 = XML_SCHEMAS_DATETIME;
          if ((((dVar3 != 0.0) || (NAN(dVar3))) || ((uVar15 & 0xffe00) != 0)) ||
             ((xVar2 != XML_SCHEMAS_DATE &&
              (((uVar14 != 1 && (xVar19 = XML_SCHEMAS_DATE, uVar24 != 1)) ||
               (xVar19 = XML_SCHEMAS_GYEARMONTH, xVar2 != XML_SCHEMAS_GYEARMONTH && uVar14 != 1)))))
             ) {
            value->type = xVar19;
          }
        }
        xmlSchemaFreeValue(value_00);
        xmlSchemaFreeValue(pxVar16);
        return value;
      }
      if (((((ulong)pxVar22 & 3) == 0) && (pxVar22 != (xmlChar *)(((long)pxVar22 / 100) * 100))) ||
         (((long)pxVar22 * -0x70a3d70a3d70a3d7 + 0x51eb851eb851eb0U >> 4 |
          (long)pxVar22 * -0x70a3d70a3d70a3d7 << 0x3c) < 0xa3d70a3d70a3d7)) {
        uVar24 = daysInMonthLeap[uVar24];
      }
      else {
        uVar24 = daysInMonth[uVar24];
      }
      if (pxVar23 <= (xmlChar *)(ulong)uVar24) goto LAB_001cd057;
      uVar18 = -(long)(ulong)uVar24;
      lVar17 = 1;
    }
    pxVar23 = pxVar23 + uVar18;
    dVar4 = (double)((int)((ulong)uVar14 + lVar17) + -1);
    dVar5 = floor(dVar4 / 12.0);
    uVar15 = uVar15 & 0xfffffff0 | (uint)(long)((dVar4 - dVar5 * 12.0) + 1.0) & 0xf;
    (value->value).hex.total = uVar15;
    pxVar22 = pxVar22 + (long)dVar5;
    if (pxVar22 == (xmlChar *)0x0) {
      pxVar22 = (xmlChar *)((ulong)(0 < (long)((ulong)uVar14 + lVar17)) * 2 + -1);
    }
    (value->value).date.year = (long)pxVar22;
  } while( true );
}

Assistant:

static xmlSchemaValPtr
xmlSchemaDateNormalize (xmlSchemaValPtr dt, double offset)
{
    xmlSchemaValPtr dur, ret;

    if (dt == NULL)
        return NULL;

    if (((dt->type != XML_SCHEMAS_TIME) &&
         (dt->type != XML_SCHEMAS_DATETIME) &&
	 (dt->type != XML_SCHEMAS_DATE)) || (dt->value.date.tzo == 0))
        return xmlSchemaDupVal(dt);

    dur = xmlSchemaNewValue(XML_SCHEMAS_DURATION);
    if (dur == NULL)
        return NULL;

    dur->value.date.sec -= offset;

    ret = _xmlSchemaDateAdd(dt, dur);
    if (ret == NULL)
        return NULL;

    xmlSchemaFreeValue(dur);

    /* ret->value.date.tzo = 0; */
    return ret;
}